

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseFunction
          (Parser *this,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps)

{
  Capabilities *__args_1;
  Capabilities *pCVar1;
  bool bVar2;
  Token *pTVar3;
  reference this_00;
  pointer pTVar4;
  pointer pEVar5;
  Position *__args_2;
  Position *pPVar6;
  unique_ptr *in_RDX;
  undefined1 local_1c8 [14];
  undefined2 local_1ba;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_1b8;
  undefined1 local_1b0 [32];
  undefined1 local_190 [8];
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> body;
  undefined1 local_169;
  _Base_ptr local_168;
  undefined1 local_160 [8];
  undefined1 local_158 [16];
  bool autoDetect;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> returnExpr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_138;
  _Base_ptr local_128;
  undefined1 local_120 [8];
  undefined1 local_118 [8];
  undefined1 local_110 [8];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  undefined1 local_f0 [8];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> returnExprPos;
  undefined1 local_d0 [8];
  vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  parameters;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_b0;
  undefined1 local_a8 [16];
  Token *tok;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> result;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_80;
  undefined1 local_78 [32];
  TemplateDecls local_58;
  undefined1 local_40 [8];
  TemplateDecls templ;
  bool err;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps_local;
  Parser *this_local;
  
  sanityExpect((Parser *)caps,TOK_KW_FN);
  templ.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
            *)local_40);
  pTVar3 = Lexer::getCurrentToken
                     ((Lexer *)(caps->_M_t).
                               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
  bVar2 = Token::operator==(pTVar3,TOK_OP_TEMPL_BRACKET_OPEN);
  if (bVar2) {
    parseTemplateDecl(&local_58,(Parser *)caps);
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::operator=((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                 *)local_40,&local_58);
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::~vector(&local_58);
    bVar2 = std::
            vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
            ::empty((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                     *)local_40);
    if (bVar2) {
      templ.
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
  }
  pTVar3 = Lexer::getCurrentToken
                     ((Lexer *)(caps->_M_t).
                               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
  bVar2 = Token::operator==(pTVar3,TOK_KW_TYPE);
  if (bVar2) {
    bVar2 = std::
            vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
            ::empty((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                     *)local_40);
    if (!bVar2) {
      local_78._14_2_ = 2;
      local_78._8_4_ = 0xd;
      this_00 = std::
                vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                ::at((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                      *)local_40,0);
      pTVar4 = std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>::
               operator->(this_00);
      pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         (&pTVar4->expr);
      Expr::getPosition(pEVar5);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_78 + 0x10),(SyntaxErrorCode *)(local_78 + 0xe),
                 (Position *)(local_78 + 8));
      generateError((Parser *)(local_78 + 0x18),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)caps);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_78 + 0x18));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_78 + 0x10));
      templ.
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
    bVar2 = std::unique_ptr::operator_cast_to_bool(in_RDX);
    if (bVar2) {
      result._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._6_2_ = 2;
      result._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._0_4_ = 0xe;
      pTVar3 = Lexer::getCurrentToken
                         ((Lexer *)(caps->_M_t).
                                   super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                   .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                   _M_head_impl);
      Token::getPosition(pTVar3);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&local_80,
                 (SyntaxErrorCode *)
                 ((long)&result._M_t.
                         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                         .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 6),
                 (Position *)&result);
      generateError((Parser *)local_78,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)caps);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_78);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr(&local_80);
      templ.
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
    parseFuncType((Parser *)&stack0xffffffffffffff70);
    if ((templ.
         super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                 &stack0xffffffffffffff70);
    }
    else {
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<std::default_delete<pfederc::Expr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0
                );
    }
    tok._4_4_ = 1;
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
               &stack0xffffffffffffff70);
    goto LAB_0013adc8;
  }
  local_a8._8_8_ =
       Lexer::getCurrentToken
                 ((Lexer *)(caps->_M_t).
                           super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                           .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
  bVar2 = expect((Parser *)caps,TOK_ID);
  if ((!bVar2) &&
     ((templ.
       super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0)) {
    templ.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    parameters.
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ = 2;
    parameters.
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
    pTVar3 = Lexer::getCurrentToken
                       ((Lexer *)(caps->_M_t).
                                 super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                 .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl
                       );
    Token::getPosition(pTVar3);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&local_b0,
               (SyntaxErrorCode *)
               ((long)&parameters.
                       super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),
               (Position *)
               &parameters.
                super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    generateError((Parser *)local_a8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)caps);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_a8)
    ;
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr(&local_b0);
  }
  std::
  vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  ::vector((vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
            *)local_d0);
  pTVar3 = Lexer::getCurrentToken
                     ((Lexer *)(caps->_M_t).
                               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
  bVar2 = Token::operator==(pTVar3,TOK_OP_BRACKET_OPEN);
  if (bVar2) {
    parseFuncParameters((vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                         *)&returnExprPos,(Parser *)caps);
    std::
    vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ::operator=((vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                 *)local_d0,
                (vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                 *)&returnExprPos);
    std::
    vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ::~vector((vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
               *)&returnExprPos);
    bVar2 = std::
            vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
            ::empty((vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                     *)local_d0);
    if (bVar2) {
      templ.
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
  }
  pTVar3 = Lexer::getCurrentToken
                     ((Lexer *)(caps->_M_t).
                               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
  bVar2 = Token::operator==(pTVar3,TOK_OP_ASG);
  if (bVar2) {
    Lexer::next((Lexer *)(caps->_M_t).
                         super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                         .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
    parseExpression((Parser *)local_f0,(Precedence)caps);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_f0);
    if (!bVar2) {
      templ.
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
    pTVar3 = Lexer::getCurrentToken
                       ((Lexer *)(caps->_M_t).
                                 super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                 .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl
                       );
    bVar2 = Token::operator!=(pTVar3,TOK_EOF);
    if (bVar2) {
      pTVar3 = Lexer::getCurrentToken
                         ((Lexer *)(caps->_M_t).
                                   super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                   .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                   _M_head_impl);
      bVar2 = Token::operator!=(pTVar3,TOK_EOL);
      if (bVar2) {
        local_108._6_2_ = 2;
        local_108._0_4_ = 0xf;
        pTVar3 = Lexer::getCurrentToken
                           ((Lexer *)(caps->_M_t).
                                     super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                     .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                     _M_head_impl);
        Token::getPosition(pTVar3);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_108 + 8),(SyntaxErrorCode *)(local_108 + 6),(Position *)local_108
                  );
        generateError((Parser *)local_f8,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)caps);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   local_f8);
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_108 + 8));
        templ.
        super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      }
    }
    Lexer::next((Lexer *)(caps->_M_t).
                         super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                         .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
    if ((templ.
         super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      pCVar1 = (caps->_M_t).
               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
               ._M_t.
               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
      pPVar6 = Token::getPosition((Token *)local_a8._8_8_);
      local_118 = (undefined1  [8])0x0;
      __args_1 = (caps->_M_t).
                 super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                 .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
      pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_f0
                         );
      __args_2 = Expr::getPosition(pEVar5);
      local_138._M_allocated_capacity = 0;
      local_138._8_8_ = 0;
      local_128 = (_Base_ptr)0x0;
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                *)&local_138);
      returnExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
      .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._4_4_ = 1;
      std::
      make_unique<pfederc::BodyExpr,pfederc::Lexer&,pfederc::Position_const&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,pfederc::ReturnControlType>
                ((Lexer *)local_120,(Position *)__args_1,
                 (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                  *)__args_2,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                 &local_138._M_allocated_capacity,(ReturnControlType *)local_f0);
      returnExpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
      .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._3_1_ = 1;
      std::
      make_unique<pfederc::FuncExpr,pfederc::Lexer&,pfederc::Position_const&,std::unique_ptr<pfederc::Capabilities,std::default_delete<pfederc::Capabilities>>,pfederc::Token_const*&,std::vector<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>,std::allocator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>>>,std::vector<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>,std::allocator<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>>>,decltype(nullptr),std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>,bool>
                ((Lexer *)local_110,(Position *)pCVar1,
                 (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
                 pPVar6,(Token **)in_RDX,
                 (vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                  *)((long)local_a8 + 8),
                 (vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                  *)local_40,(void **)local_d0,
                 (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_118
                 ,(bool *)local_120);
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                 (unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)local_110
                );
      std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)local_110
                );
      std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_120
                );
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                 *)&local_138);
    }
    else {
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<std::default_delete<pfederc::Expr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0
                );
    }
    tok._4_4_ = 1;
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_f0);
  }
  else {
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<std::default_delete<pfederc::Expr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)
               &stack0xfffffffffffffeb8);
    local_158[0xf] = 0;
    pTVar3 = Lexer::getCurrentToken
                       ((Lexer *)(caps->_M_t).
                                 super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                 .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl
                       );
    bVar2 = Token::operator==(pTVar3,TOK_OP_DCL);
    if (bVar2) {
      Lexer::next((Lexer *)(caps->_M_t).
                           super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                           .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
      pTVar3 = Lexer::getCurrentToken
                         ((Lexer *)(caps->_M_t).
                                   super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                   .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                   _M_head_impl);
      bVar2 = Token::operator==(pTVar3,TOK_EOL);
      if (bVar2) {
        local_158[0xf] = 1;
      }
      else {
        parseFuncReturnType((Parser *)local_158);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                   &stack0xfffffffffffffeb8,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_158);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_158);
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xfffffffffffffeb8);
        if (!bVar2) {
          templ.
          super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        }
      }
    }
    if ((local_158[0xf] & 1) == 0) {
      pTVar3 = Lexer::getCurrentToken
                         ((Lexer *)(caps->_M_t).
                                   super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                   .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                   _M_head_impl);
      bVar2 = Token::operator==(pTVar3,TOK_STMT);
      if (!bVar2) goto LAB_0013aa85;
      Lexer::next((Lexer *)(caps->_M_t).
                           super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                           .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
      if ((templ.
           super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        pCVar1 = (caps->_M_t).
                 super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                 .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
        pPVar6 = Token::getPosition((Token *)local_a8._8_8_);
        local_168 = (_Base_ptr)0x0;
        local_169 = 0;
        std::
        make_unique<pfederc::FuncExpr,pfederc::Lexer&,pfederc::Position_const&,std::unique_ptr<pfederc::Capabilities,std::default_delete<pfederc::Capabilities>>,pfederc::Token_const*&,std::vector<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>,std::allocator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>>>,std::vector<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>,std::allocator<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,decltype(nullptr),bool>
                  ((Lexer *)local_160,(Position *)pCVar1,
                   (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *
                   )pPVar6,(Token **)in_RDX,
                   (vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                    *)((long)local_a8 + 8),
                   (vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                    *)local_40,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_d0,
                   (void **)&stack0xfffffffffffffeb8,(bool *)&local_168);
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)
                   local_160);
        std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)
                   local_160);
        tok._4_4_ = 1;
      }
      else {
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<std::default_delete<pfederc::Expr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (nullptr_t)0x0);
        tok._4_4_ = 1;
      }
    }
    else {
LAB_0013aa85:
      bVar2 = expect((Parser *)caps,TOK_EOL);
      if (bVar2) {
        parseFunctionBody((Parser *)local_190);
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_190);
        if (bVar2) {
          bVar2 = expect((Parser *)caps,TOK_STMT);
          if (bVar2) {
            if ((templ.
                 super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
              pCVar1 = (caps->_M_t).
                       super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                       .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
              pPVar6 = Token::getPosition((Token *)local_a8._8_8_);
              std::
              make_unique<pfederc::FuncExpr,pfederc::Lexer&,pfederc::Position_const&,std::unique_ptr<pfederc::Capabilities,std::default_delete<pfederc::Capabilities>>,pfederc::Token_const*&,std::vector<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>,std::allocator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>>>,std::vector<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>,std::allocator<std::unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>,bool&>
                        ((Lexer *)local_1c8,(Position *)pCVar1,
                         (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                          *)pPVar6,(Token **)in_RDX,
                         (vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                          *)((long)local_a8 + 8),
                         (vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                          *)local_40,
                         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_d0,
                         (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
                         &stack0xfffffffffffffeb8,(bool *)local_190);
              std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
              unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>,void>
                        ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                         (unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)
                         local_1c8);
              std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::
              ~unique_ptr((unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)
                          local_1c8);
            }
            else {
              std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
              unique_ptr<std::default_delete<pfederc::Expr>,void>
                        ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                         (nullptr_t)0x0);
            }
          }
          else {
            local_1ba = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
            local_1c8._8_4_ = 0xc;
            pTVar3 = Lexer::getCurrentToken
                               ((Lexer *)(caps->_M_t).
                                         super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                         .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                         _M_head_impl);
            Token::getPosition(pTVar3);
            std::
            make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                      ((Level *)&local_1b8,(SyntaxErrorCode *)&local_1ba,(Position *)(local_1c8 + 8)
                      );
            generateError((Parser *)local_1b0,
                          (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)caps);
            std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
            ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                        local_1b0);
            std::
            unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
            ::~unique_ptr(&local_1b8);
            std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
            unique_ptr<std::default_delete<pfederc::Expr>,void>
                      ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                       (nullptr_t)0x0);
          }
        }
        else {
          bVar2 = expect((Parser *)caps,TOK_STMT);
          if (bVar2) {
            std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
            unique_ptr<std::default_delete<pfederc::Expr>,void>
                      ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                       (nullptr_t)0x0);
          }
          else {
            local_1b0._14_2_ = 2;
            local_1b0._8_4_ = 0xc;
            pTVar3 = Lexer::getCurrentToken
                               ((Lexer *)(caps->_M_t).
                                         super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                         .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                         _M_head_impl);
            Token::getPosition(pTVar3);
            std::
            make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                      ((Level *)(local_1b0 + 0x10),(SyntaxErrorCode *)(local_1b0 + 0xe),
                       (Position *)(local_1b0 + 8));
            generateError((Parser *)(local_1b0 + 0x18),
                          (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)caps);
            std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
            ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                        (local_1b0 + 0x18));
            std::
            unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
            ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)(local_1b0 + 0x10));
            std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
            unique_ptr<std::default_delete<pfederc::Expr>,void>
                      ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                       (nullptr_t)0x0);
          }
        }
        tok._4_4_ = 1;
        std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
                   local_190);
      }
      else {
        body._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
        _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
        super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._6_2_ = 2;
        body._M_t.super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
        _M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
        super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._0_4_ = 0xb;
        pTVar3 = Lexer::getCurrentToken
                           ((Lexer *)(caps->_M_t).
                                     super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                     .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                     _M_head_impl);
        Token::getPosition(pTVar3);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)&stack0xfffffffffffffe80,
                   (SyntaxErrorCode *)
                   ((long)&body._M_t.
                           super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                           .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl + 6),
                   (Position *)&body);
        generateError((Parser *)&stack0xfffffffffffffe88,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)caps);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   &stack0xfffffffffffffe88);
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)&stack0xfffffffffffffe80);
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<std::default_delete<pfederc::Expr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (nullptr_t)0x0);
        tok._4_4_ = 1;
      }
    }
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
               &stack0xfffffffffffffeb8);
  }
  std::
  vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  ::~vector((vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
             *)local_d0);
LAB_0013adc8:
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
             *)local_40);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseFunction(std::unique_ptr<Capabilities> &&caps) noexcept {
  sanityExpect(TokenType::TOK_KW_FN);

  bool err = false;

  TemplateDecls templ;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_TEMPL_BRACKET_OPEN) {
    templ = parseTemplateDecl();
    if (templ.empty())
      err = true;
  }

  if (*lexer.getCurrentToken() == TokenType::TOK_KW_TYPE) {
    if (!templ.empty()) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_FUNC_VAR_NO_TEMPL, templ.at(0)->expr->getPosition()));
      err = true;
    }

    if (!!caps) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_FUNC_VAR_NO_CAPS,
            lexer.getCurrentToken()->getPosition()));
      err = true;
    }

    auto result = parseFuncType();
    if (err)
      return nullptr;

    return result;
  }

  // function decl./def.
  const Token *tok = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ID) && !err) {
    err = true;
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_FUNCTION_ID, lexer.getCurrentToken()->getPosition()));
  }

  std::vector<std::unique_ptr<FuncParameter>> parameters;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_BRACKET_OPEN) {
    parameters = parseFuncParameters();
    if (parameters.empty())
      err = true;
  }
  // assign to expression
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_ASG) {
    lexer.next(); // eat =

    std::unique_ptr<Expr> returnExprPos(parseExpression());
    if (!returnExprPos)
      err = true;

    if (*lexer.getCurrentToken() != TokenType::TOK_EOF
        && *lexer.getCurrentToken() != TokenType::TOK_EOL) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      err = true;
    }

    lexer.next();

    if (err)
      return nullptr;

    return std::make_unique<FuncExpr>(lexer, tok->getPosition(), std::move(caps),
      tok, std::move(templ), std::move(parameters),
      nullptr,
      std::make_unique<BodyExpr>(lexer, returnExprPos->getPosition(),
        Exprs(), std::move(returnExprPos), ReturnControlType::RETURN), true);
  }

  std::unique_ptr<Expr> returnExpr;
  bool autoDetect = false;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_DCL) {
    lexer.next();
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      autoDetect = true;
    } else {
      // return type
      returnExpr = parseFuncReturnType();
      if (!returnExpr)
        err = true;
    }
  }
  // declaration
  if (!autoDetect && *lexer.getCurrentToken() == TokenType::TOK_STMT) {
    lexer.next(); // eat ;
    if (err)
      return nullptr;

    // function declaration
    return std::make_unique<FuncExpr>(lexer, tok->getPosition(),
      std::move(caps),
      tok, std::move(templ), std::move(parameters),
      std::move(returnExpr), nullptr, false);
  }

  // body
  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_FN_DCL_DEF, lexer.getCurrentToken()->getPosition()));
    return nullptr;
  }

  std::unique_ptr<BodyExpr> body(parseFunctionBody());
  if (!body) {
    if (!expect(TokenType::TOK_STMT)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition()));
      return nullptr;
    }

    return nullptr;
  }

  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition()));
    return nullptr;
  } 

  if (err)
    return nullptr;

  return std::make_unique<FuncExpr>(lexer, tok->getPosition(), std::move(caps),
    tok, std::move(templ), std::move(parameters),
    std::move(returnExpr), std::move(body), autoDetect);
}